

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

bool __thiscall
OpenMD::FragmentStamp::addRigidBodyStamp(FragmentStamp *this,RigidBodyStamp *rigidbody)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  OpenMDException *this_00;
  ostringstream oss;
  string local_1b8;
  ostringstream local_198 [376];
  
  bVar2 = addIndexSensitiveStamp<std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>,OpenMD::RigidBodyStamp>
                    (this,&this->rigidBodyStamps_,rigidbody);
  if (bVar2) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Error in Fragment ",0x12)
  ;
  pcVar1 = (this->Name).data_._M_dataplus._M_p;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,": multiple rigidbodies have the same indices: ",0x2e);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rigidbody->index_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1b8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

bool FragmentStamp::addRigidBodyStamp(RigidBodyStamp* rigidbody) {
    bool ret = addIndexSensitiveStamp(rigidBodyStamps_, rigidbody);
    if (!ret) {
      std::ostringstream oss;
      oss << "Error in Fragment " << getName()
          << ": multiple rigidbodies have the same indices: "
          << rigidbody->getIndex() << "\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }